

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::Initialize
          (Recycler *this,bool forceInThread,ThreadService *threadService,bool deferThreadStartup,
          PageHeapMode pageheapmode,bool captureAllocCallStack,bool captureFreeCallStack)

{
  HeapInfoManager *this_00;
  ConfigFlagsTable *pCVar1;
  Boolean BVar2;
  Boolean BVar3;
  Boolean BVar4;
  DWORD DVar5;
  bool bVar6;
  DWORD DVar7;
  RecyclerMemoryData *pRVar8;
  ThreadContextId pvVar9;
  
  InitializeProfileAllocTracker(this);
  bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,RecyclerPhase);
  this->disableCollection = bVar6;
  this->skipStack = false;
  bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,PartialCollectPhase);
  this->enablePartialCollect = !bVar6;
  pRVar8 = MemoryProfiler::GetRecyclerMemoryData();
  this->memoryData = pRVar8;
  pvVar9 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  this->mainThreadId = pvVar9;
  (this->collectionParam).domCollect = false;
  this_00 = &this->autoHeap;
  if ((this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) ||
     ((this->verifyEnabled & 1U) == 0)) {
    HeapInfoManager::Initialize
              (this_00,this,TrackNativeAllocatedMemoryBlock,pageheapmode,captureAllocCallStack,
               captureFreeCallStack);
  }
  else {
    HeapInfoManager::Initialize
              (this_00,this,pageheapmode,captureAllocCallStack,captureFreeCallStack);
  }
  MarkContext::Init(&this->markContext,2);
  this->isPrimaryMarkContextInitialized = true;
  bVar6 = HeapInfoManager::IsPageHeapEnabled(this_00);
  this->isPageHeapEnabled = bVar6;
  if (bVar6) {
    bVar6 = HeapInfoManager::DoCaptureAllocCallStack(this_00);
    this->capturePageHeapAllocStack = bVar6;
    bVar6 = HeapInfoManager::DoCaptureFreeCallStack(this_00);
    this->capturePageHeapFreeStack = bVar6;
  }
  pCVar1 = this->recyclerFlagsTable;
  if (pCVar1->RecyclerTrackStress == true) {
    this->enablePartialCollect = false;
  }
  BVar2 = pCVar1->RecyclerBackgroundStress;
  BVar3 = pCVar1->RecyclerConcurrentStress;
  BVar4 = pCVar1->RecyclerConcurrentRepeatStress;
  this->recyclerStress = pCVar1->RecyclerStress;
  this->recyclerBackgroundStress = BVar2;
  this->recyclerConcurrentStress = BVar3;
  this->recyclerConcurrentRepeatStress = BVar4;
  this->recyclerPartialStress = pCVar1->RecyclerPartialStress;
  DVar5 = AutoSystemInfo::Data.dwNumberOfPhysicalProcessors;
  DVar7 = 4;
  if (AutoSystemInfo::Data.dwNumberOfPhysicalProcessors < 5) {
    bVar6 = Js::Phases::IsEnabled(&pCVar1->Force,ParallelMarkPhase);
    DVar7 = DVar5;
    if (bVar6) {
      DVar7 = 4;
    }
  }
  this->maxParallelism = DVar7;
  if (((forceInThread) ||
      (bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ConcurrentCollectPhase), bVar6))
     || ((bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ConcurrentMarkPhase), bVar6
         && ((bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ParallelMarkPhase), bVar6
             && (bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Off,ConcurrentSweepPhase),
                bVar6)))))) {
    this->disableConcurrent = true;
  }
  else {
    this->disableConcurrent = false;
    if (!deferThreadStartup) {
      EnableConcurrent(this,threadService,false);
    }
  }
  CCLock::Enter(&recyclerListLock.super_CCLock);
  this->next = recyclerList;
  recyclerList = this;
  CCLock::Leave(&recyclerListLock.super_CCLock);
  return;
}

Assistant:

void
Recycler::Initialize(const bool forceInThread, JsUtil::ThreadService *threadService, const bool deferThreadStartup
#ifdef RECYCLER_PAGE_HEAP
    , PageHeapMode pageheapmode
    , bool captureAllocCallStack
    , bool captureFreeCallStack
#endif
)
{
#ifdef PROFILE_RECYCLER_ALLOC
    this->InitializeProfileAllocTracker();
#endif
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    this->disableCollection = CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::RecyclerPhase);
#endif
#if ENABLE_CONCURRENT_GC
    this->skipStack = false;
#endif

#if ENABLE_PARTIAL_GC
#if ENABLE_DEBUG_CONFIG_OPTIONS
    this->enablePartialCollect = !CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::PartialCollectPhase);
#else
    this->enablePartialCollect = true;
#endif
#endif

#ifdef PROFILE_MEM
    this->memoryData = MemoryProfiler::GetRecyclerMemoryData();
#endif

#if DBG || DBG_DUMP || defined(RECYCLER_TRACE)
    mainThreadId = GetCurrentThreadContextId();
#endif

#ifdef RECYCLER_TRACE
    collectionParam.domCollect = false;
#endif

#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY) || defined(MEMSPECT_TRACKING) || defined(ETW_MEMORY_TRACKING)
    bool dontNeedDetailedTracking = false;

#if defined(PROFILE_RECYCLER_ALLOC)
    dontNeedDetailedTracking = dontNeedDetailedTracking || this->trackerDictionary == nullptr;
#endif

#if defined(RECYCLER_MEMORY_VERIFY)
    dontNeedDetailedTracking = dontNeedDetailedTracking || !this->verifyEnabled;
#endif

    // If we need detailed tracking we force allocation fast path in the JIT to fail and go to the helper, so there is no
    // need for the TrackNativeAllocatedMemoryBlock callback.
    if (dontNeedDetailedTracking)
    {
        autoHeap.Initialize(this, TrackNativeAllocatedMemoryBlock
#ifdef RECYCLER_PAGE_HEAP
            , pageheapmode
            , captureAllocCallStack
            , captureFreeCallStack
#endif
        );
    }
    else
    {
        autoHeap.Initialize(this
#ifdef RECYCLER_PAGE_HEAP
            , pageheapmode
            , captureAllocCallStack
            , captureFreeCallStack
#endif
        );
    }
#else
    autoHeap.Initialize(this
#ifdef RECYCLER_PAGE_HEAP
        , pageheapmode
        , captureAllocCallStack
        , captureFreeCallStack
#endif
    );
#endif

    markContext.Init(Recycler::PrimaryMarkStackReservedPageCount);

#if defined(RECYCLER_DUMP_OBJECT_GRAPH) || defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
    isPrimaryMarkContextInitialized = true;
#endif

#ifdef RECYCLER_PAGE_HEAP
    isPageHeapEnabled = autoHeap.IsPageHeapEnabled();
    if (IsPageHeapEnabled())
    {
        capturePageHeapAllocStack = autoHeap.DoCaptureAllocCallStack();
        capturePageHeapFreeStack = autoHeap.DoCaptureFreeCallStack();
    }
#endif

#ifdef RECYCLER_STRESS
#if ENABLE_PARTIAL_GC
    if (GetRecyclerFlagsTable().RecyclerTrackStress)
    {
        // Disable partial if we are doing track stress, since partial relies on ClientTracked processing
        // and track stress doesn't support this.
        this->enablePartialCollect = false;
    }
#endif

    this->recyclerStress = GetRecyclerFlagsTable().RecyclerStress;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = GetRecyclerFlagsTable().RecyclerBackgroundStress;
    this->recyclerConcurrentStress = GetRecyclerFlagsTable().RecyclerConcurrentStress;
    this->recyclerConcurrentRepeatStress = GetRecyclerFlagsTable().RecyclerConcurrentRepeatStress;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = GetRecyclerFlagsTable().RecyclerPartialStress;
#endif
#endif

    bool needWriteWatch = false;

#if ENABLE_CONCURRENT_GC
    // Default to non-concurrent
    uint numProcs = (uint)AutoSystemInfo::Data.GetNumberOfPhysicalProcessors();
    this->maxParallelism = (numProcs > 4) || CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase) ? 4 : numProcs;

    if (forceInThread)
    {
        // Requested a non-concurrent recycler
        this->disableConcurrent = true;
    }
#if ENABLE_DEBUG_CONFIG_OPTIONS
    else if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentCollectPhase))
    {
        // Concurrent collection disabled
        this->disableConcurrent = true;
    }
    else if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentMarkPhase) &&
        CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ParallelMarkPhase) &&
        CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ConcurrentSweepPhase))
    {
        // All concurrent collection phases disabled
        this->disableConcurrent = true;
    }
#endif
    else
    {
        this->disableConcurrent = false;

        if (deferThreadStartup || EnableConcurrent(threadService, false))
        {
#ifdef RECYCLER_WRITE_WATCH
            needWriteWatch = true;
#endif
        }
    }
#endif // ENABLE_CONCURRENT_GC

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect)
    {
#ifdef RECYCLER_WRITE_WATCH
        needWriteWatch = true;
#endif
    }
#endif

#if ENABLE_PARTIAL_GC || ENABLE_CONCURRENT_GC
#ifdef RECYCLER_WRITE_WATCH
    if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        if (needWriteWatch)
        {
            // need write watch to support concurrent and/or partial collection
            autoHeap.EnableWriteWatch();
        }
    }
#endif
#else
    Assert(!needWriteWatch);
#endif
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    recyclerListLock.Enter();
    this->next = recyclerList;
    recyclerList = this;
    recyclerListLock.Leave();
#endif
}